

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

Quat __thiscall rw::Matrix::getRotation(Matrix *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar7;
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar13 [16];
  undefined8 uVar12;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  Quat QVar17;
  
  fVar1 = (float)(this->right).x;
  fVar15 = (float)(this->up).y;
  fVar11 = (float)(this->at).z;
  fVar16 = fVar1 + fVar15 + fVar11;
  if (fVar16 <= 0.0) {
    if ((fVar1 <= fVar15) || (fVar1 <= fVar11)) {
      if (fVar15 <= fVar11) {
        fVar15 = ((fVar11 + 1.0) - fVar1) - fVar15;
        if (fVar15 < 0.0) {
          fVar15 = sqrtf(fVar15);
        }
        else {
          fVar15 = SQRT(fVar15);
        }
        fVar15 = fVar15 + fVar15;
        uVar3 = (this->at).x;
        uVar5 = (this->at).y;
        auVar10._0_4_ = (float)(this->right).z + (float)uVar3;
        auVar10._4_4_ = (float)(this->up).z + (float)uVar5;
        auVar10._8_4_ = (float)(this->up).x + 0.0;
        auVar10._12_4_ = (float)(this->up).y + 0.0;
        auVar9._4_4_ = fVar15;
        auVar9._0_4_ = fVar15;
        auVar9._8_4_ = fVar15;
        auVar9._12_4_ = fVar15;
        auVar9 = divps(auVar10,auVar9);
        uVar7 = auVar9._0_8_;
        uVar12 = CONCAT44(((float)(this->right).y - (float)(this->up).x) / fVar15,fVar15 * 0.25);
        goto LAB_00108347;
      }
      fVar11 = ((fVar15 + 1.0) - fVar1) - fVar11;
      if (fVar11 < 0.0) {
        fVar11 = sqrtf(fVar11);
      }
      else {
        fVar11 = SQRT(fVar11);
      }
      fVar11 = fVar11 + fVar11;
      uVar7 = CONCAT44(fVar11 * 0.25,((float)(this->up).x + (float)(this->right).y) / fVar11);
      uVar2 = (this->at).x;
      uVar4 = (this->at).y;
      auVar14._4_4_ = (float)uVar2 - (float)(this->right).z;
      auVar14._0_4_ = (float)(this->up).z + (float)uVar4;
      auVar14._8_4_ = (float)(this->up).x + 0.0;
      auVar14._12_4_ = (float)(this->up).y + 0.0;
    }
    else {
      fVar11 = ((fVar1 + 1.0) - fVar15) - fVar11;
      if (fVar11 < 0.0) {
        fVar11 = sqrtf(fVar11);
      }
      else {
        fVar11 = SQRT(fVar11);
      }
      fVar11 = fVar11 + fVar11;
      uVar7 = CONCAT44(((float)(this->up).x + (float)(this->right).y) / fVar11,fVar11 * 0.25);
      auVar14._4_4_ = (float)(this->up).z - (float)(this->at).y;
      auVar14._0_4_ = (float)(this->right).z + (float)(this->at).x;
      auVar14._8_4_ = (float)(this->up).x + (float)(this->at).z;
      auVar14._12_4_ = (float)(this->up).y + (float)this->pad2;
    }
    auVar6._4_4_ = fVar11;
    auVar6._0_4_ = fVar11;
    auVar6._8_4_ = fVar11;
    auVar6._12_4_ = fVar11;
    auVar9 = divps(auVar14,auVar6);
    uVar12 = auVar9._0_8_;
  }
  else {
    fVar16 = fVar16 + 1.0;
    if (fVar16 < 0.0) {
      fVar16 = sqrtf(fVar16);
    }
    else {
      fVar16 = SQRT(fVar16);
    }
    fVar16 = fVar16 + fVar16;
    auVar8._0_4_ = (float)(this->up).z - (float)(this->at).y;
    auVar8._4_4_ = (float)(this->at).x - (float)(this->right).z;
    auVar8._8_4_ = (float)(this->at).x - (float)this->pad2;
    auVar8._12_4_ = (float)(this->at).y - (float)(this->pos).x;
    auVar13._4_4_ = fVar16;
    auVar13._0_4_ = fVar16;
    auVar13._8_4_ = fVar16;
    auVar13._12_4_ = fVar16;
    auVar9 = divps(auVar8,auVar13);
    uVar7 = auVar9._0_8_;
    uVar12 = CONCAT44(fVar16 * 0.25,((float)(this->right).y - (float)(this->up).x) / fVar16);
  }
LAB_00108347:
  QVar17.z = (float32)(int)uVar12;
  QVar17.w = (float32)(int)((ulong)uVar12 >> 0x20);
  QVar17.x = (float32)(int)uVar7;
  QVar17.y = (float32)(int)((ulong)uVar7 >> 0x20);
  return QVar17;
}

Assistant:

Quat
Matrix::getRotation(void)
{
	Quat q = { 0.0f, 0.0f, 0.0f, 1.0f };
	float32 tr = right.x + up.y + at.z;
	float s;
	if(tr > 0.0f){
		s = sqrtf(1.0f + tr) * 2.0f;
		q.w = s / 4.0f;
		q.x = (up.z - at.y) / s;
		q.y = (at.x - right.z) / s;
		q.z = (right.y - up.x) / s;
	}else if(right.x > up.y && right.x > at.z){
		s = sqrtf(1.0f + right.x - up.y - at.z) * 2.0f;
		q.w = (up.z - at.y) / s;
		q.x = s / 4.0f;
		q.y = (up.x + right.y) / s;
		q.z = (at.x + right.z) / s;
	}else if(up.y > at.z){
		s = sqrtf(1.0f + up.y - right.x - at.z) * 2.0f;
		q.w = (at.x - right.z) / s;
		q.x = (up.x + right.y) / s;
		q.y = s / 4.0f;
		q.z = (at.y + up.z) / s;
	}else{
		s = sqrtf(1.0f + at.z - right.x - up.y) * 2.0f;
		q.w = (right.y - up.x) / s;
		q.x = (at.x + right.z) / s;
		q.y = (at.y + up.z) / s;
		q.z = s / 4.0f;
	}
	return q;
}